

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_parity_s256_256_30(mzd_local_t *c,mzd_local_t *v,mzd_local_t *At)

{
  undefined1 auVar1 [32];
  undefined8 uVar2;
  word256 v3;
  word256 v2;
  word256 v1;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long in_RDX;
  undefined1 (*in_RSI) [32];
  long in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint j;
  word256 Ablock3;
  word256 Ablock2;
  word256 Ablock1;
  uint i;
  word256 res;
  word256 vblock;
  uint local_2c4;
  undefined8 local_280;
  undefined8 uStackY_278;
  longlong lStackY_270;
  undefined8 uStackY_268;
  int local_244;
  ulong local_240;
  ulong uStackY_238;
  ulong uStackY_230;
  ulong uStackY_228;
  ulong local_1a0;
  ulong uStackY_198;
  ulong uStackY_190;
  ulong uStackY_188;
  undefined1 in_stack_ffffffffffffff60 [16];
  longlong in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  longlong in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  ulong in_stack_ffffffffffffffa8;
  longlong in_stack_ffffffffffffffb0;
  undefined8 uStack_48;
  
  uVar2 = *(undefined8 *)(*in_RSI + 0x18);
  auVar5 = *in_RSI;
  auVar4 = *in_RSI;
  auVar3 = *in_RSI;
  local_240 = 0;
  uStackY_238 = 0;
  uStackY_230 = 0;
  uStackY_228 = 0;
  for (local_244 = 0x1e; local_244 != 0; local_244 = local_244 + -3) {
    auVar1 = vpand_avx2(auVar3,*(undefined1 (*) [32])(in_RDX + (ulong)(0x1e - local_244) * 0x20));
    vpand_avx2(auVar4,*(undefined1 (*) [32])(in_RDX + (ulong)(0x1f - local_244) * 0x20));
    vpand_avx2(auVar5,*(undefined1 (*) [32])(in_RDX + (ulong)(0x20 - local_244) * 0x20));
    local_280 = auVar1._0_8_;
    uStackY_278 = auVar1._8_8_;
    lStackY_270 = auVar1._16_8_;
    uStackY_268 = auVar1._24_8_;
    v1[1] = in_stack_ffffffffffffffa0;
    v1[0] = in_stack_ffffffffffffff98;
    v1[2] = in_stack_ffffffffffffffa8;
    v1[3] = in_stack_ffffffffffffffb0;
    v2[1] = in_stack_ffffffffffffff80;
    v2[0] = in_stack_ffffffffffffff78;
    v2[2] = in_stack_ffffffffffffff88;
    v2[3] = in_stack_ffffffffffffff90;
    v3[1] = in_stack_ffffffffffffff60._0_8_;
    v3[2] = in_stack_ffffffffffffff60._8_8_;
    v3[0] = uVar2;
    v3[3] = in_stack_ffffffffffffff70;
    mm256_parity_3(v1,v2,v3);
    in_stack_ffffffffffffffa8 = CONCAT44(0,0x40 - local_244);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = in_stack_ffffffffffffffa8;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = in_stack_ffffffffffffffa8;
    auVar6 = vpunpcklqdq_avx(auVar6,auVar7);
    in_stack_ffffffffffffff70 = auVar6._0_8_;
    uStack_48 = auVar6._8_8_;
    auVar1._8_8_ = uStackY_278;
    auVar1._0_8_ = local_280;
    auVar1._16_8_ = lStackY_270;
    auVar1._24_8_ = uStackY_268;
    auVar1 = vpsllq_avx2(auVar1,auVar6);
    local_1a0 = auVar1._0_8_;
    uStackY_198 = auVar1._8_8_;
    uStackY_190 = auVar1._16_8_;
    uStackY_188 = auVar1._24_8_;
    local_240 = local_240 ^ local_1a0;
    uStackY_238 = uStackY_238 ^ uStackY_198;
    uStackY_230 = uStackY_230 ^ uStackY_190;
    uStackY_228 = uStackY_228 ^ uStackY_188;
    in_stack_ffffffffffffff78 = uStack_48;
    in_stack_ffffffffffffff80 = local_280;
    in_stack_ffffffffffffff88 = uStackY_278;
    in_stack_ffffffffffffff90 = lStackY_270;
    in_stack_ffffffffffffff98 = uStackY_268;
    in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff70;
  }
  for (local_2c4 = 0; local_2c4 < 3; local_2c4 = local_2c4 + 1) {
    *(undefined8 *)(in_RDI + (ulong)local_2c4 * 8) = 0;
  }
  *(ulong *)(in_RDI + 0x18) = local_240 ^ uStackY_238 ^ uStackY_230 ^ uStackY_228;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_mul_v_parity_s256_256_30(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* At) {
  const word256 vblock = mm256_load(v->w64);
  word256 res          = mm256_zero;
  // process 3 rows at a time
  for (unsigned int i = 30; i; i -= 3) {
    const word256 Ablock1 = mm256_and(vblock, mm256_load(CONST_BLOCK(At, 30 - i)->w64));
    const word256 Ablock2 = mm256_and(vblock, mm256_load(CONST_BLOCK(At, 30 - i + 1)->w64));
    const word256 Ablock3 = mm256_and(vblock, mm256_load(CONST_BLOCK(At, 30 - i + 2)->w64));

    res = mm256_xor(
        res, _mm256_sll_epi64(mm256_parity_3(Ablock1, Ablock2, Ablock3), _mm_set1_epi64x(64 - i)));
  }

  for (unsigned int j = 0; j < 3; j++) {
    c->w64[j] = 0;
  }

  // combine the parities of each quad word
#if defined(__x86_64__) || defined(_M_X64)
  c->w64[3] = _mm256_extract_epi64(res, 0) ^ _mm256_extract_epi64(res, 1) ^
              _mm256_extract_epi64(res, 2) ^ _mm256_extract_epi64(res, 3);
#else
  // workaround for missing _mm256_extract_epi64 on x86-32
  uint64_t tmp[4] ATTR_ALIGNED(sizeof(word256));
  mm256_store(tmp, res);
  c->w64[3] = tmp[0] ^ tmp[1] ^ tmp[2] ^ tmp[3];
#endif
}